

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CSeqStatement::Copy(CSeqStatement *this)

{
  _func_int **pp_Var1;
  pointer *__ptr;
  long in_RSI;
  _func_int *local_28;
  _func_int *local_20;
  
  pp_Var1 = (_func_int **)operator_new(0x18);
  (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_28);
  (**(code **)(**(long **)(in_RSI + 0x10) + 0x18))(&local_20);
  *pp_Var1 = (_func_int *)&PTR_Accept_001810a8;
  pp_Var1[1] = local_28;
  pp_Var1[2] = local_20;
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode = pp_Var1;
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CSeqStatement::Copy( ) const {
    return std::move(
            std::unique_ptr<const CStatement>( new CSeqStatement( leftStatement->Copy( ), rightStatement->Copy( ))));
}